

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

bool __thiscall
SchemePrimitiveProcedure::is_eq(SchemePrimitiveProcedure *this,shared_ptr<SchemeObject> *a)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t __n;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  peVar1 = (a->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar3 = __dynamic_cast(peVar1,&SchemeObject::typeinfo,&typeinfo,0);
    if (lVar3 != 0) {
      this_00 = (a->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      __n = (this->super_SchemeProcedure).name._M_string_length;
      if (__n == *(size_t *)(lVar3 + 0x10)) {
        if (__n == 0) {
          bVar4 = true;
        }
        else {
          iVar2 = bcmp((this->super_SchemeProcedure).name._M_dataplus._M_p,*(void **)(lVar3 + 8),__n
                      );
          bVar4 = iVar2 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return bVar4;
}

Assistant:

bool SchemePrimitiveProcedure::is_eq(const std::shared_ptr<SchemeObject> &a) const
{
    auto p = std::dynamic_pointer_cast<SchemePrimitiveProcedure>(a);
    return p && name == p->name;
}